

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsGear::ArchiveIN(ChShaftsGear *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsGear>(marchive);
  ChArchiveIn::VersionRead<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveIN((ChPhysicsItem *)this,marchive);
  local_30 = &this->ratio;
  local_38 = "ratio";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&this->avoid_phase_drift;
  local_38 = "avoid_phase_drift";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = &this->phase1;
  local_38 = "phase1";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->phase2;
  local_38 = "phase2";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsGear::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsGear>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(ratio);
    marchive >> CHNVP(avoid_phase_drift);
    marchive >> CHNVP(phase1);
    marchive >> CHNVP(phase2);
}